

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O1

void updateReg(int nodeIndex)

{
  WINDOW *pWVar1;
  pointer pnVar2;
  string local_40;
  
  pnVar2 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pWVar1 = grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
           _M_start[nodeIndex].w_reg;
  makeThreeDigit_abi_cxx11_
            (&local_40,
             (int)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                  super__Vector_impl_data._M_start[nodeIndex].acc);
  mvwprintw(pWVar1,1,0,"%s",local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pWVar1 = pnVar2[nodeIndex].w_reg;
  makeThreeDigit_abi_cxx11_(&local_40,(int)pnVar2[nodeIndex].bak);
  mvwprintw(pWVar1,3,0,"%s",local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  wrefresh(pnVar2[nodeIndex].w_reg);
  return;
}

Assistant:

void updateReg(int nodeIndex) {
  node *tmp_node = &grid[nodeIndex];

  mvwprintw(tmp_node->w_reg, 1, 0, "%s", makeThreeDigit(tmp_node->acc).c_str());
  mvwprintw(tmp_node->w_reg, 3, 0, "%s", makeThreeDigit(tmp_node->bak).c_str());
  wrefresh(tmp_node->w_reg);
}